

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  Vdbe *p;
  bool bVar1;
  Vdbe *v;
  char *zAff_local;
  int n_local;
  int base_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  v = (Vdbe *)zAff;
  zAff_local._0_4_ = n;
  zAff_local._4_4_ = base;
  if (zAff != (char *)0x0) {
    while( true ) {
      bVar1 = false;
      if (0 < (int)zAff_local) {
        bVar1 = *(char *)&v->db == 'b';
      }
      if (!bVar1) break;
      zAff_local._0_4_ = (int)zAff_local + -1;
      zAff_local._4_4_ = zAff_local._4_4_ + 1;
      v = (Vdbe *)((long)&v->db + 1);
    }
    while( true ) {
      bVar1 = false;
      if (1 < (int)zAff_local) {
        bVar1 = *(char *)((long)&v->db + (long)((int)zAff_local + -1)) == 'b';
      }
      if (!bVar1) break;
      zAff_local._0_4_ = (int)zAff_local + -1;
    }
    if (0 < (int)zAff_local) {
      sqlite3VdbeAddOp2(p,0x1e,zAff_local._4_4_,(int)zAff_local);
      sqlite3VdbeChangeP4(p,-1,(char *)v,(int)zAff_local);
      sqlite3ExprCacheAffinityChange(pParse,zAff_local._4_4_,(int)zAff_local);
    }
  }
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_NONE entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_NONE ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_NONE ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp2(v, OP_Affinity, base, n);
    sqlite3VdbeChangeP4(v, -1, zAff, n);
    sqlite3ExprCacheAffinityChange(pParse, base, n);
  }
}